

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

char * lyd_path_set(ly_set *dnodes,LYD_PATH_TYPE pathtype)

{
  lyd_node *plVar1;
  size_t sVar2;
  int iVar3;
  LY_ERR LVar4;
  lys_module *plVar5;
  lysc_node *plVar6;
  lys_module *plVar7;
  lys_module *plVar8;
  size_t sVar9;
  lysc_node **pplVar10;
  char *pcVar11;
  char *pcVar12;
  lyd_node *node;
  long lVar13;
  ulong size;
  uint uVar14;
  bool bVar15;
  char *buffer;
  size_t buflen;
  size_t bufused;
  char *local_60;
  size_t local_58;
  size_t local_50;
  LYD_PATH_TYPE local_44;
  ly_set *local_40;
  lyd_node *local_38;
  
  local_50 = 0;
  local_58 = 0;
  local_60 = (char *)0x0;
  if ((LYD_PATH_STD_NO_LAST_PRED < pathtype) || (dnodes->count == 0)) {
    return (char *)0x0;
  }
  uVar14 = 1;
  local_44 = pathtype;
  local_40 = dnodes;
  do {
    plVar1 = (dnodes->field_2).dnodes[uVar14 - 1];
    plVar5 = lyd_node_module(plVar1);
    if (uVar14 < 2) {
      node = (lyd_node *)0x0;
    }
    else {
      node = (dnodes->field_2).dnodes[uVar14 - 2];
    }
    if ((((node != (lyd_node *)0x0) && (plVar1->schema != (lysc_node *)0x0)) &&
        (node->schema != (lysc_node *)0x0)) &&
       (((node->schema->nodetype & 0x60) == 0 &&
        (plVar6 = lysc_data_node(plVar1->schema->parent), plVar6 != node->schema)))) {
      if (plVar1->schema == (lysc_node *)0x0) {
        plVar6 = (lysc_node *)0x0;
      }
      else {
        plVar6 = plVar1->schema->parent;
      }
      plVar6 = lysc_data_node(plVar6);
      if (plVar6 == (lysc_node *)0x0) {
        if (plVar1->schema == (lysc_node *)0x0) {
          plVar7 = (lys_module *)&plVar1[2].schema;
        }
        else {
          plVar7 = plVar1->schema->module;
        }
        if (node->schema == (lysc_node *)0x0) {
          plVar8 = (lys_module *)&node[2].schema;
        }
        else {
          plVar8 = node->schema->module;
        }
        if (plVar7->ctx != plVar8->ctx) goto LAB_00123941;
      }
      if ((node->schema->nodetype & 0x700) == 0) {
        __assert_fail("!parent || !iter->schema || !parent->schema || (parent->schema->nodetype & LYD_NODE_ANY) || (lysc_data_parent(iter->schema) == parent->schema) || (!lysc_data_parent(iter->schema) && (LYD_CTX(iter) != LYD_CTX(parent))) || (parent->schema->nodetype & (LYS_RPC | LYS_ACTION | LYS_NOTIF))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                      ,0xb74,"char *lyd_path_set(const struct ly_set *, LYD_PATH_TYPE)");
      }
    }
LAB_00123941:
    plVar8 = lyd_node_module(node);
    plVar7 = (lys_module *)0x0;
    if (plVar8 != plVar5) {
      plVar7 = plVar5;
    }
    if (plVar7 == (lys_module *)0x0) {
      lVar13 = 2;
    }
    else {
      sVar9 = strlen(plVar7->name);
      lVar13 = sVar9 + 3;
    }
    pplVar10 = (lysc_node **)&plVar1->schema->name;
    if (plVar1->schema == (lysc_node *)0x0) {
      pplVar10 = &plVar1[1].schema;
    }
    local_38 = plVar1;
    sVar9 = strlen((char *)*pplVar10);
    sVar2 = local_50;
    size = lVar13 + local_50 + sVar9;
    if ((local_58 < size) &&
       (local_60 = (char *)ly_realloc(local_60,size), local_58 = size, local_60 == (char *)0x0)) {
      return (char *)0x0;
    }
    plVar1 = local_38;
    pcVar12 = "";
    pcVar11 = "";
    if (plVar7 != (lys_module *)0x0) {
      pcVar12 = plVar7->name;
      pcVar11 = ":";
    }
    bVar15 = local_44 == LYD_PATH_STD;
    LVar4 = LY_SUCCESS;
    iVar3 = sprintf(local_60 + sVar2,"/%s%s%s",pcVar12,pcVar11);
    dnodes = local_40;
    local_50 = (long)iVar3 + sVar2;
    if ((bVar15 || 1 < uVar14) && (plVar6 = plVar1->schema, plVar6 != (lysc_node *)0x0)) {
      if (plVar6->nodetype == 8) {
        if ((plVar6->flags & 1) == 0) {
LAB_00123a78:
          LVar4 = lyd_path_position_predicate(plVar1,&local_60,&local_58,&local_50,'\0');
        }
        else {
          LVar4 = lyd_path_leaflist_predicate(plVar1,&local_60,&local_58,&local_50,'\0');
        }
      }
      else if (plVar6->nodetype == 0x10) {
        if ((plVar6->flags & 0x200) != 0) goto LAB_00123a78;
        LVar4 = lyd_path_list_predicate(plVar1,&local_60,&local_58,&local_50,'\0');
      }
    }
    if (LVar4 != LY_SUCCESS) {
      return local_60;
    }
    uVar14 = uVar14 + 1;
    if (dnodes->count < uVar14) {
      return local_60;
    }
  } while( true );
}

Assistant:

char *
lyd_path_set(const struct ly_set *dnodes, LYD_PATH_TYPE pathtype)
{
    uint32_t depth;
    size_t bufused = 0, buflen = 0, len;
    char *buffer = NULL;
    const struct lyd_node *iter, *parent;
    const struct lys_module *mod, *prev_mod;
    LY_ERR rc = LY_SUCCESS;

    switch (pathtype) {
    case LYD_PATH_STD:
    case LYD_PATH_STD_NO_LAST_PRED:
        for (depth = 1; depth <= dnodes->count; ++depth) {
            /* current node */
            iter = dnodes->dnodes[depth - 1];
            mod = lyd_node_module(iter);

            /* parent */
            parent = (depth > 1) ? dnodes->dnodes[depth - 2] : NULL;
            assert(!parent || !iter->schema || !parent->schema || (parent->schema->nodetype & LYD_NODE_ANY) ||
                    (lysc_data_parent(iter->schema) == parent->schema) ||
                    (!lysc_data_parent(iter->schema) && (LYD_CTX(iter) != LYD_CTX(parent))) ||
                    (parent->schema->nodetype & (LYS_RPC | LYS_ACTION | LYS_NOTIF)));

            /* get module to print, if any */
            prev_mod = lyd_node_module(parent);
            if (prev_mod == mod) {
                mod = NULL;
            }

            /* realloc string */
            len = 1 + (mod ? strlen(mod->name) + 1 : 0) + (iter->schema ? strlen(iter->schema->name) :
                    strlen(((struct lyd_node_opaq *)iter)->name.name));
            if ((rc = lyd_path_str_enlarge(&buffer, &buflen, bufused + len, 0))) {
                break;
            }

            /* print next node */
            bufused += sprintf(buffer + bufused, "/%s%s%s", mod ? mod->name : "", mod ? ":" : "", LYD_NAME(iter));

            /* do not always print the last (first) predicate */
            if (iter->schema && ((depth > 1) || (pathtype == LYD_PATH_STD))) {
                switch (iter->schema->nodetype) {
                case LYS_LIST:
                    if (iter->schema->flags & LYS_KEYLESS) {
                        /* print its position */
                        rc = lyd_path_position_predicate(iter, &buffer, &buflen, &bufused, 0);
                    } else {
                        /* print all list keys in predicates */
                        rc = lyd_path_list_predicate(iter, &buffer, &buflen, &bufused, 0);
                    }
                    break;
                case LYS_LEAFLIST:
                    if (iter->schema->flags & LYS_CONFIG_W) {
                        /* print leaf-list value */
                        rc = lyd_path_leaflist_predicate(iter, &buffer, &buflen, &bufused, 0);
                    } else {
                        /* print its position */
                        rc = lyd_path_position_predicate(iter, &buffer, &buflen, &bufused, 0);
                    }
                    break;
                default:
                    /* nothing to print more */
                    break;
                }
            }
            if (rc) {
                break;
            }
        }
        break;
    }

    return buffer;
}